

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CALLBACK::Convert(_Type_CALLBACK *this,Variable *object,Type *type)

{
  bool bVar1;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  Variable *result;
  Variable VVar4;
  stringstream ss;
  string local_1f0;
  String local_1d0;
  Number local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_boolean);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)type);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)this);
    *(undefined1 *)pOVar2->data = 1;
    puVar3 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(in_RCX,(Type *)_type_number);
    if (bVar1) {
      pOVar2 = Variable::operator->((Variable *)type);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->((Variable *)type);
      Number::Number(local_1b0,pOVar2->ID);
      pOVar2 = Variable::operator->((Variable *)this);
      Number::operator=((Number *)pOVar2->data,local_1b0);
      puVar3 = extraout_RDX_00;
    }
    else {
      bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
      pOVar2 = Variable::operator->((Variable *)type);
      if (bVar1) {
        Memory::Create((Memory *)this,(Type *)pOVar2->memory);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        Variable::operator->((Variable *)type);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        std::__cxx11::stringbuf::str();
        String::String(&local_1d0,&local_1f0);
        pOVar2 = Variable::operator->((Variable *)this);
        String::operator=((String *)pOVar2->data,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_1d0.str._M_dataplus._M_p != &local_1d0.str.field_2) {
          operator_delete(local_1d0.str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
        std::ios_base::~ios_base(local_130);
        puVar3 = extraout_RDX_01;
      }
      else {
        VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
        puVar3 = VVar4.nb_ref;
      }
    }
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CALLBACK::Convert(const Variable &object, const Type &type) const {
    if (type == Type::BOOLEAN) {
        Variable result = object->memory.Create(Type::BOOLEAN);
        result->GetData<bool>() = true;
        return result;
    }
    else if (type == Type::NUMBER) {
        Variable result = object->memory.Create(Type::NUMBER);
        result->GetData<Number>() = Number((int)object->ID);
        return result;
    }
    else if (type == Type::STRING) {
        Variable result = object->memory.Create(Type::STRING);
        std::stringstream ss;
        ss << object->ID;
        result->GetData<String>() = String(ss.str());
        return result;
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}